

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tv_ctrlpt.c
# Opt level: O0

void TvCtrlPointPrintCommands(void)

{
  int local_c;
  int numofcmds;
  int i;
  
  SampleUtil_Print("Valid Commands:\n");
  for (local_c = 0; local_c < 0x12; local_c = local_c + 1) {
    SampleUtil_Print("  %-14s %s\n",cmdloop_cmdlist[local_c].str,cmdloop_cmdlist[local_c].args);
  }
  SampleUtil_Print("\n");
  return;
}

Assistant:

void TvCtrlPointPrintCommands(void)
{
	int i;
	int numofcmds = (sizeof cmdloop_cmdlist) / sizeof(cmdloop_commands);

	SampleUtil_Print("Valid Commands:\n");
	for (i = 0; i < numofcmds; ++i) {
		SampleUtil_Print("  %-14s %s\n",
			cmdloop_cmdlist[i].str,
			cmdloop_cmdlist[i].args);
	}
	SampleUtil_Print("\n");
}